

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O3

Word * __thiscall VM::word(VM *this,uint address)

{
  pointer pWVar1;
  logic_error *plVar2;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((address & 3) != 0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unaligned memory access","")
    ;
    std::logic_error::logic_error(plVar2,(string *)local_40);
    *(undefined ***)plVar2 = &PTR__logic_error_00113d80;
    __cxa_throw(plVar2,&VMException::typeinfo,std::logic_error::~logic_error);
  }
  pWVar1 = (this->_program).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(address >> 2) <
      (ulong)((long)(this->_program).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pWVar1 >> 2)) {
    return pWVar1 + (address >> 2);
  }
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"out of program memory access","");
  std::logic_error::logic_error(plVar2,(string *)local_60);
  *(undefined ***)plVar2 = &PTR__logic_error_00113d80;
  __cxa_throw(plVar2,&VMException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Word &VM::word(unsigned address) {
    if(address % 4) {
        throw VMException{"unaligned memory access"};
    }
    if(address / 4 >= _program.size()) {
        throw VMException{"out of program memory access"};
    }
    return _program[address / 4];
}